

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O3

err_t cmdSigVerify2(char *name,char *sig_name,octet *anchor,size_t anchor_len)

{
  octet *poVar1;
  bign_params *params;
  octet *hash;
  size_t sVar2;
  bool_t bVar3;
  err_t eVar4;
  cmd_sig_t *sig;
  size_t sVar5;
  char *oid;
  octet *pubkey;
  size_t drop;
  size_t oid_len;
  size_t cert_len;
  size_t offset;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = 0x10;
  bVar3 = strIsValid(name);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = strIsValid(sig_name);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsValid(anchor,anchor_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  sig = (cmd_sig_t *)blobCreate(0x8f8);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  eVar4 = cmdSigRead(sig,&local_50,sig_name);
  if (eVar4 == 0) {
    bVar3 = cmdFileAreSame(name,sig_name);
    sVar2 = local_50;
    if (bVar3 == 0) {
      sVar5 = cmdFileSize(sig_name);
      eVar4 = 0x132;
      if (sVar2 != sVar5) goto LAB_00106e0c;
      local_50 = 0;
    }
    poVar1 = sig->certs;
    eVar4 = cmdCVCsFind((size_t *)0x0,poVar1,sig->certs_len,anchor,anchor_len);
    if (eVar4 == 0) {
      eVar4 = cmdCVCsVal(poVar1,sig->certs_len,sig->date);
      if (((eVar4 == 0) &&
          (eVar4 = cmdCVCsGetLast(&local_38,&local_40,poVar1,sig->certs_len), eVar4 == 0)) &&
         (eVar4 = btokCVCUnwrap((btok_cvc_t *)(sig + 1),poVar1 + local_38,local_40,(octet *)0x0,0),
         eVar4 == 0)) {
        params = (bign_params *)(sig[1].certs + 0xc0);
        eVar4 = cmdSigParamsStd(params,*(ulong *)(sig[1].certs + 0x38) >> 1);
        if (eVar4 == 0) {
          hash = sig[1].certs + 0x220;
          eVar4 = cmdSigHash(hash,*(ulong *)(sig[1].certs + 0x38) >> 1,name,local_50,poVar1,
                             sig->certs_len,sig->date);
          if (eVar4 == 0) {
            poVar1 = sig[1].certs + 0x210;
            if (*(ulong *)(sig[1].certs + 0x38) < 0x41) {
              oid = "1.2.112.0.2.0.34.101.31.81";
            }
            else {
              oid = "1.2.112.0.2.0.34.101.77.13";
              if (*(ulong *)(sig[1].certs + 0x38) == 0x60) {
                oid = "1.2.112.0.2.0.34.101.77.12";
              }
            }
            eVar4 = bignOidToDER(poVar1,&local_48,oid);
            if (eVar4 == 0) {
              pubkey = sig[1].sig + 0x1a;
              if (*(long *)(sig[1].certs + 0x38) == 0x30) {
                eVar4 = bign96PubkeyVal(params,pubkey);
              }
              else {
                eVar4 = bignPubkeyVal(params,pubkey);
              }
              if (eVar4 == 0) {
                if (*(long *)(sig[1].certs + 0x38) == 0x30) {
                  eVar4 = bign96Verify(params,poVar1,local_48,hash,(octet *)sig,pubkey);
                }
                else {
                  eVar4 = bignVerify(params,poVar1,local_48,hash,(octet *)sig,pubkey);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00106e0c:
  blobClose(sig);
  return eVar4;
}

Assistant:

err_t cmdSigVerify2(const char* name, const char* sig_name,
	const octet anchor[], size_t anchor_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	btok_cvc_t* cvc;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	size_t drop;
	size_t offset;
	size_t cert_len;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(sig_name) ||
		!memIsValid(anchor, anchor_len))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t) + sizeof(btok_cvc_t) +
		sizeof(bign_params) + oid_len + 64);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	cvc = (btok_cvc_t*)(sig + 1);
	params = (bign_params*)(cvc + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + oid_len;
	// читать подпись
	code = cmdSigRead(sig, &drop, sig_name);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// подпись в отдельном файле?
	if (!cmdFileAreSame(name, sig_name))
	{
		code = drop == cmdFileSize(sig_name) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		drop = 0;
	}
	// цепочка сертификатов включает anchor?
	code = cmdCVCsFind(0, sig->certs, sig->certs_len, anchor, anchor_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить цепочку
	code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// найти последний сертификат
	code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// разобрать последний сертификат
	code = btokCVCUnwrap(cvc, sig->certs + offset, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, cvc->pubkey_len / 2);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, cvc->pubkey_len / 2, name, drop, sig->certs, 
		sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (cvc->pubkey_len <= 64)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, cvc->pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (cvc->pubkey_len == 48)
		code = bign96PubkeyVal(params, cvc->pubkey);
	else
		code = bignPubkeyVal(params, cvc->pubkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить подпись
	if (cvc->pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig->sig, 
			cvc->pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig->sig, 
			cvc->pubkey);
	// завершить
	cmdBlobClose(stack);
	return code;
}